

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O2

void __thiscall sc_core::sc_in<sc_dt::sc_logic>::end_of_elaboration(sc_in<sc_dt::sc_logic> *this)

{
  pointer ppsVar1;
  sc_trace_params *psVar2;
  sc_trace_file *tf;
  int iVar3;
  sc_trace_params_vec *psVar4;
  long *plVar5;
  sc_logic *object;
  undefined8 in_R8;
  undefined8 in_R9;
  int i;
  long lVar6;
  sc_trace_params_vec *psVar7;
  
  psVar4 = this->m_traces;
  if (psVar4 != (sc_trace_params_vec *)0x0) {
    psVar7 = psVar4;
    for (lVar6 = 0;
        ppsVar1 = (psVar4->
                  super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        lVar6 < (int)((ulong)((long)(psVar4->
                                    super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar1) >>
                     3); lVar6 = lVar6 + 1) {
      psVar2 = ppsVar1[lVar6];
      iVar3 = (*(this->
                super_sc_port<sc_core::sc_signal_in_if<sc_dt::sc_logic>,_1,_(sc_core::sc_port_policy)0>
                ).super_sc_port_b<sc_core::sc_signal_in_if<sc_dt::sc_logic>_>.super_sc_port_base.
                super_sc_object._vptr_sc_object[0xf])(this);
      plVar5 = (long *)__dynamic_cast(iVar3,&sc_interface::typeinfo,
                                      &sc_signal_in_if<sc_dt::sc_logic>::typeinfo,0xffffffffffffffff
                                      ,in_R8,in_R9,psVar7);
      tf = psVar2->tf;
      object = (sc_logic *)(**(code **)(*plVar5 + 0x38))(plVar5);
      sc_core::sc_trace(tf,object,&psVar2->name);
      psVar4 = this->m_traces;
    }
    remove_traces(this);
    return;
  }
  return;
}

Assistant:

void
sc_in<sc_dt::sc_logic>::end_of_elaboration()
{
    if( m_traces != 0 ) {
	for( int i = 0; i < (int)m_traces->size(); ++ i ) {
	    sc_trace_params* p = (*m_traces)[i];
	    in_if_type* iface = dynamic_cast<in_if_type*>( get_interface() );
	    sc_trace( p->tf, iface->read(), p->name );
	}
	remove_traces();
    }
}